

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

Cluster * __thiscall mkvparser::Segment::GetNext(Segment *this,Cluster *pCurr)

{
  Cluster **ppCVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  longlong lVar5;
  longlong lVar6;
  Cluster *pCVar7;
  Cluster **ppCVar8;
  long lVar9;
  Cluster **ppCVar10;
  long lVar11;
  long lVar12;
  Cluster **ppCVar13;
  long lVar14;
  long len;
  long len_;
  longlong pos_;
  long local_50;
  long local_48;
  long local_40;
  longlong local_38;
  
  if (pCurr == (Cluster *)0x0) {
    __assert_fail("pCurr",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9de,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
  }
  if (&this->m_eos == pCurr) {
    __assert_fail("pCurr != &m_eos",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9df,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
  }
  ppCVar1 = this->m_clusters;
  if (ppCVar1 == (Cluster **)0x0) {
    __assert_fail("m_clusters",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9e0,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
  }
  uVar2 = pCurr->m_index;
  if (-1 < (long)uVar2) {
    uVar3 = this->m_clusterCount;
    if ((long)uVar3 < 1) {
      __assert_fail("m_clusterCount > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9e5,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (uVar3 <= uVar2) {
      __assert_fail("idx < m_clusterCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9e6,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (ppCVar1[uVar2] != pCurr) {
      __assert_fail("pCurr == m_clusters[idx]",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9e7,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (uVar2 + 1 < uVar3) {
      pCVar7 = ppCVar1[uVar2 + 1];
      if (pCVar7 == (Cluster *)0x0) {
        __assert_fail("pNext",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x9ef,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      if (pCVar7->m_index < 0) {
        __assert_fail("pNext->m_index >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x9f0,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      if (pCVar7->m_index != uVar2 + 1) {
        __assert_fail("pNext->m_index == idx",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x9f1,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      return pCVar7;
    }
    return &this->m_eos;
  }
  if (this->m_clusterPreloadCount < 1) {
    __assert_fail("m_clusterPreloadCount > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9f6,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
  }
  if (this->m_size < 0) {
    __assert_fail("m_size >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9fa,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
  }
  lVar12 = pCurr->m_element_start;
  lVar11 = this->m_size + this->m_start;
  lVar5 = GetUIntLength(this->m_pReader,lVar12,&local_50);
  if (lVar5 != 0) {
    __assert_fail("result == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xa01,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
  }
  if (lVar11 < local_50 + lVar12) {
    __assert_fail("(pos + len) <= stop",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xa02,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
  }
  lVar5 = ReadID(this->m_pReader,lVar12,&local_50);
  if (lVar5 == 0x1f43b675) {
    lVar12 = lVar12 + local_50;
    lVar5 = GetUIntLength(this->m_pReader,lVar12,&local_50);
    if (lVar5 != 0) {
      __assert_fail("result == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xa0e,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (lVar11 < local_50 + lVar12) {
      __assert_fail("(pos + len) <= stop",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xa0f,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    lVar5 = ReadUInt(this->m_pReader,lVar12,&local_50);
    if (lVar5 < 1) {
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xa12,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    lVar12 = lVar5 + lVar12 + local_50;
    if (lVar11 < lVar12) {
      __assert_fail("(pos + size) <= stop",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xa16,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (lVar12 < lVar11) {
      do {
        lVar5 = GetUIntLength(this->m_pReader,lVar12,&local_50);
        if (lVar5 != 0) {
          __assert_fail("result == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa23,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        if (lVar11 < local_50 + lVar12) {
          __assert_fail("(pos + len) <= stop",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa24,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        lVar5 = ReadID(this->m_pReader,lVar12,&local_50);
        if (lVar5 < 0) {
          return (Cluster *)0x0;
        }
        lVar14 = local_50 + lVar12;
        local_48 = lVar12;
        lVar6 = GetUIntLength(this->m_pReader,lVar14,&local_50);
        if (lVar6 != 0) {
          __assert_fail("result == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa32,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        if (lVar11 < local_50 + lVar14) {
          __assert_fail("(pos + len) <= stop",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa33,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        lVar6 = ReadUInt(this->m_pReader,lVar14,&local_50);
        if (lVar6 < 0) {
          __assert_fail("size >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa36,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        lVar9 = lVar14 + local_50 + lVar6;
        if (lVar11 < lVar9) {
          __assert_fail("(pos + size) <= stop",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa39,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        lVar12 = lVar14 + local_50;
        if ((lVar6 != 0) && (lVar12 = lVar9, lVar5 == 0x1f43b675)) {
          lVar9 = local_48 - this->m_start;
          lVar14 = Cluster::HasBlockEntries(this,lVar9,&local_38,&local_40);
          if (lVar14 < 0) {
            __assert_fail("status >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0xa48,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
          }
          if (lVar14 != 0) {
            if (lVar9 < 1) {
              return (Cluster *)0x0;
            }
            ppCVar13 = this->m_clusters + this->m_clusterCount;
            ppCVar1 = ppCVar13 + this->m_clusterPreloadCount;
            ppCVar8 = ppCVar1;
            ppCVar10 = ppCVar1;
            if (0 < this->m_clusterPreloadCount) {
              do {
                ppCVar8 = (Cluster **)
                          ((long)ppCVar13 +
                          (((long)ppCVar10 - (long)ppCVar13 >> 3) -
                           ((long)ppCVar10 - (long)ppCVar13 >> 0x3f) & 0xfffffffffffffffeU) * 4);
                if (ppCVar1 <= ppCVar8) {
                  __assert_fail("k < jj",
                                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                                ,0xa63,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)"
                               );
                }
                pCVar7 = *ppCVar8;
                if (pCVar7 == (Cluster *)0x0) {
                  __assert_fail("pNext",
                                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                                ,0xa66,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)"
                               );
                }
                if (-1 < pCVar7->m_index) {
                  __assert_fail("pNext->m_index < 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                                ,0xa67,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)"
                               );
                }
                lVar12 = pCVar7->m_element_start - pCVar7->m_pSegment->m_start;
                if (lVar12 < 0) {
                  __assert_fail("pos >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                                ,0x1adb,"long long mkvparser::Cluster::GetPosition() const");
                }
                if (lVar12 < lVar9) {
                  ppCVar13 = ppCVar8 + 1;
                  ppCVar8 = ppCVar10;
                }
                else if (lVar12 <= lVar9) {
                  return pCVar7;
                }
                ppCVar10 = ppCVar8;
              } while (ppCVar13 < ppCVar8);
            }
            if (ppCVar13 != ppCVar8) {
              __assert_fail("i == j",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0xa77,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
            }
            pCVar7 = Cluster::Create(this,-1,lVar9);
            if (pCVar7 == (Cluster *)0x0) {
              return (Cluster *)0x0;
            }
            lVar12 = (long)ppCVar13 - (long)this->m_clusters;
            lVar11 = lVar12 >> 3;
            bVar4 = PreloadCluster(this,pCVar7,lVar11);
            if (!bVar4) {
              Cluster::~Cluster(pCVar7);
              operator_delete(pCVar7);
              return (Cluster *)0x0;
            }
            if (this->m_clusters != (Cluster **)0x0) {
              if (this->m_clusterSize <= lVar11) {
                __assert_fail("idx_next < m_clusterSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                              ,0xa84,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
              }
              if (*(Cluster **)((long)this->m_clusters + lVar12) != pCVar7) {
                __assert_fail("m_clusters[idx_next] == pNext",
                              "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                              ,0xa85,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
              }
              return pCVar7;
            }
            __assert_fail("m_clusters",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0xa83,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
          }
        }
      } while (lVar12 < lVar11);
    }
  }
  return (Cluster *)0x0;
}

Assistant:

const Cluster* Segment::GetNext(const Cluster* pCurr) {
  assert(pCurr);
  assert(pCurr != &m_eos);
  assert(m_clusters);

  long idx = pCurr->m_index;

  if (idx >= 0) {
    assert(m_clusterCount > 0);
    assert(idx < m_clusterCount);
    assert(pCurr == m_clusters[idx]);

    ++idx;

    if (idx >= m_clusterCount)
      return &m_eos;  // caller will LoadCluster as desired

    Cluster* const pNext = m_clusters[idx];
    assert(pNext);
    assert(pNext->m_index >= 0);
    assert(pNext->m_index == idx);

    return pNext;
  }

  assert(m_clusterPreloadCount > 0);

  long long pos = pCurr->m_element_start;

  assert(m_size >= 0);  // TODO
  const long long stop = m_start + m_size;  // end of segment

  {
    long len;

    long long result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);
    assert((pos + len) <= stop);  // TODO
    if (result != 0)
      return NULL;

    const long long id = ReadID(m_pReader, pos, len);
    if (id != libwebm::kMkvCluster)
      return NULL;

    pos += len;  // consume ID

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);  // TODO
    assert((pos + len) <= stop);  // TODO

    const long long size = ReadUInt(m_pReader, pos, len);
    assert(size > 0);  // TODO
    // assert((pCurr->m_size <= 0) || (pCurr->m_size == size));

    pos += len;  // consume length of size of element
    assert((pos + size) <= stop);  // TODO

    // Pos now points to start of payload

    pos += size;  // consume payload
  }

  long long off_next = 0;

  while (pos < stop) {
    long len;

    long long result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);
    assert((pos + len) <= stop);  // TODO
    if (result != 0)
      return NULL;

    const long long idpos = pos;  // pos of next (potential) cluster

    const long long id = ReadID(m_pReader, idpos, len);
    if (id < 0)
      return NULL;

    pos += len;  // consume ID

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);  // TODO
    assert((pos + len) <= stop);  // TODO

    const long long size = ReadUInt(m_pReader, pos, len);
    assert(size >= 0);  // TODO

    pos += len;  // consume length of size of element
    assert((pos + size) <= stop);  // TODO

    // Pos now points to start of payload

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvCluster) {
      const long long off_next_ = idpos - m_start;

      long long pos_;
      long len_;

      const long status = Cluster::HasBlockEntries(this, off_next_, pos_, len_);

      assert(status >= 0);

      if (status > 0) {
        off_next = off_next_;
        break;
      }
    }

    pos += size;  // consume payload
  }

  if (off_next <= 0)
    return 0;

  Cluster** const ii = m_clusters + m_clusterCount;
  Cluster** i = ii;

  Cluster** const jj = ii + m_clusterPreloadCount;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[0, i) < pos_next
    //[i, j) ?
    //[j, jj)  > pos_next

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pNext = *k;
    assert(pNext);
    assert(pNext->m_index < 0);

    // const long long pos_ = pNext->m_pos;
    // assert(pos_);
    // pos = pos_ * ((pos_ < 0) ? -1 : 1);

    pos = pNext->GetPosition();

    if (pos < off_next)
      i = k + 1;
    else if (pos > off_next)
      j = k;
    else
      return pNext;
  }

  assert(i == j);

  Cluster* const pNext = Cluster::Create(this, -1, off_next);
  if (pNext == NULL)
    return NULL;

  const ptrdiff_t idx_next = i - m_clusters;  // insertion position

  if (!PreloadCluster(pNext, idx_next)) {
    delete pNext;
    return NULL;
  }
  assert(m_clusters);
  assert(idx_next < m_clusterSize);
  assert(m_clusters[idx_next] == pNext);

  return pNext;
}